

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O3

void __thiscall iDynTree::SensorsList::constructor(SensorsList *this,SensorsList *other)

{
  pointer pmVar1;
  SensorsListPimpl *this_00;
  undefined4 extraout_var;
  Sensor *pSVar2;
  pointer pvVar3;
  pointer ppSVar4;
  long lVar5;
  vector<iDynTree::Sensor*,std::allocator<iDynTree::Sensor*>> *this_01;
  ulong sensor_index;
  string sensor_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_98;
  long local_68;
  long *local_60;
  long local_58;
  long local_50 [2];
  long local_40;
  long local_38;
  
  this_00 = (SensorsListPimpl *)operator_new(0x30);
  (this_00->allSensors).
  super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->allSensors).
  super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->allSensors).
  super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->sensorsNameToIndex).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->sensorsNameToIndex).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->sensorsNameToIndex).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pimpl = this_00;
  local_98.first._M_dataplus._M_p = (pointer)0x0;
  local_98.first._M_string_length = 0;
  local_98.first.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::resize((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
            *)this_00,5,(value_type *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_98.first._M_dataplus._M_p,
                    local_98.first.field_2._M_allocated_capacity -
                    (long)local_98.first._M_dataplus._M_p);
  }
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ::resize(&this->pimpl->sensorsNameToIndex,5);
  pvVar3 = (other->pimpl->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  do {
    ppSVar4 = *(pointer *)
               &pvVar3[lVar5].
                super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl;
    local_68 = lVar5;
    if (pvVar3[lVar5].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar4) {
      local_38 = lVar5 * 0x18;
      local_40 = lVar5 * 0x30;
      sensor_index = 0;
      do {
        this_01 = (vector<iDynTree::Sensor*,std::allocator<iDynTree::Sensor*>> *)
                  ((long)&(((this->pimpl->allSensors).
                            super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + local_38);
        local_98.first._M_dataplus._M_p._0_4_ = (*ppSVar4[sensor_index]->_vptr_Sensor[6])();
        local_98.first._M_dataplus._M_p._4_4_ = extraout_var;
        std::vector<iDynTree::Sensor*,std::allocator<iDynTree::Sensor*>>::
        emplace_back<iDynTree::Sensor*>(this_01,(Sensor **)&local_98);
        local_98.first._M_dataplus._M_p._0_4_ = (int)local_68;
        pSVar2 = getSensor(other,(SensorType *)&local_98,sensor_index);
        (*pSVar2->_vptr_Sensor[2])(&local_60,pSVar2);
        pmVar1 = (this->pimpl->sensorsNameToIndex).
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_60,local_58 + (long)local_60);
        local_98.second = sensor_index;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,long>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                    *)(&(pmVar1->_M_t)._M_impl.field_0x0 + local_40),&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
          operator_delete(local_98.first._M_dataplus._M_p,
                          local_98.first.field_2._M_allocated_capacity + 1);
        }
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        sensor_index = sensor_index + 1;
        pvVar3 = (other->pimpl->allSensors).
                 super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppSVar4 = *(pointer *)
                   &pvVar3[lVar5].
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                    _M_impl;
      } while (sensor_index <
               (ulong)((long)pvVar3[lVar5].
                             super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3));
    }
    lVar5 = local_68 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

void SensorsList::constructor(const SensorsList& other)
{
    this->pimpl = new SensorsListPimpl();
    this->pimpl->allSensors.resize(NR_OF_SENSOR_TYPES,std::vector<Sensor *>(0));
    this->pimpl->sensorsNameToIndex.resize(NR_OF_SENSOR_TYPES);
    for(int sens_type = 0; sens_type < NR_OF_SENSOR_TYPES; sens_type++ )
    {
        for(std::size_t sens = 0; sens < other.getNrOfSensors((SensorType)sens_type); sens++ )
        {
            this->pimpl->allSensors[sens_type].push_back(other.pimpl->allSensors[sens_type][sens]->clone());
            std::string sensor_name = other.getSensor((SensorType)sens_type,sens)->getName();
            this->pimpl->sensorsNameToIndex[sens_type].insert(std::pair<std::string,std::ptrdiff_t>(sensor_name,sens));
        }
    }
}